

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiAnimMesh **_dest,aiAnimMesh *src)

{
  uint uVar1;
  aiVector3D *paVar2;
  aiColor4D *__src;
  aiAnimMesh *__dest;
  aiVector3D *paVar3;
  aiColor4D *__s;
  long lVar4;
  ulong uVar5;
  
  if (src != (aiAnimMesh *)0x0 && _dest != (aiAnimMesh **)0x0) {
    __dest = (aiAnimMesh *)operator_new(0x4b0);
    (__dest->mName).length = 0;
    (__dest->mName).data[0] = '\0';
    memset((__dest->mName).data + 1,0x1b,0x3ff);
    memset(&__dest->mVertices,0,0xa8);
    *_dest = __dest;
    memcpy(__dest,src,0x4b0);
    paVar2 = __dest->mVertices;
    if (paVar2 != (aiVector3D *)0x0) {
      uVar1 = __dest->mNumVertices;
      uVar5 = (ulong)uVar1 * 0xc;
      paVar3 = (aiVector3D *)operator_new__(uVar5);
      if ((ulong)uVar1 != 0) {
        memset(paVar3,0,((uVar5 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mVertices = paVar3;
      memcpy(paVar3,paVar2,uVar5);
    }
    paVar2 = __dest->mNormals;
    if (paVar2 != (aiVector3D *)0x0) {
      uVar1 = __dest->mNumVertices;
      uVar5 = (ulong)uVar1 * 0xc;
      paVar3 = (aiVector3D *)operator_new__(uVar5);
      if ((ulong)uVar1 != 0) {
        memset(paVar3,0,((uVar5 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mNormals = paVar3;
      memcpy(paVar3,paVar2,uVar5);
    }
    paVar2 = __dest->mTangents;
    if (paVar2 != (aiVector3D *)0x0) {
      uVar1 = __dest->mNumVertices;
      uVar5 = (ulong)uVar1 * 0xc;
      paVar3 = (aiVector3D *)operator_new__(uVar5);
      if ((ulong)uVar1 != 0) {
        memset(paVar3,0,((uVar5 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mTangents = paVar3;
      memcpy(paVar3,paVar2,uVar5);
    }
    paVar2 = __dest->mBitangents;
    if (paVar2 != (aiVector3D *)0x0) {
      uVar1 = __dest->mNumVertices;
      uVar5 = (ulong)uVar1 * 0xc;
      paVar3 = (aiVector3D *)operator_new__(uVar5);
      if ((ulong)uVar1 != 0) {
        memset(paVar3,0,((uVar5 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mBitangents = paVar3;
      memcpy(paVar3,paVar2,uVar5);
    }
    lVar4 = 0;
    do {
      if (__dest->mTextureCoords[lVar4] == (aiVector3D *)0x0) break;
      paVar2 = __dest->mTextureCoords[lVar4];
      if (paVar2 != (aiVector3D *)0x0) {
        uVar1 = __dest->mNumVertices;
        uVar5 = (ulong)uVar1 * 0xc;
        paVar3 = (aiVector3D *)operator_new__(uVar5);
        if ((ulong)uVar1 != 0) {
          memset(paVar3,0,((uVar5 - 0xc) / 0xc) * 0xc + 0xc);
        }
        __dest->mTextureCoords[lVar4] = paVar3;
        memcpy(paVar3,paVar2,uVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    lVar4 = 0;
    do {
      if (__dest->mColors[lVar4] == (aiColor4D *)0x0) {
        return;
      }
      __src = __dest->mColors[lVar4];
      if (__src != (aiColor4D *)0x0) {
        uVar1 = __dest->mNumVertices;
        uVar5 = (ulong)uVar1 << 4;
        __s = (aiColor4D *)operator_new__(uVar5);
        if ((ulong)uVar1 != 0) {
          memset(__s,0,uVar5);
        }
        __dest->mColors[lVar4] = __s;
        memcpy(__s,__src,uVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiAnimMesh** _dest, const aiAnimMesh* src) {
    if (nullptr == _dest || nullptr == src) {
        return;
    }

    aiAnimMesh* dest = *_dest = new aiAnimMesh();

    // get a flat copy
    ::memcpy(dest, src, sizeof(aiAnimMesh));

    // and reallocate all arrays
    GetArrayCopy(dest->mVertices, dest->mNumVertices);
    GetArrayCopy(dest->mNormals, dest->mNumVertices);
    GetArrayCopy(dest->mTangents, dest->mNumVertices);
    GetArrayCopy(dest->mBitangents, dest->mNumVertices);

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy(dest->mTextureCoords[n++], dest->mNumVertices);

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy(dest->mColors[n++], dest->mNumVertices);
}